

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                *generators,bool is_end)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer *__ptr;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  *p_Var2;
  ParamIterator<int> local_58;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> local_50;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  local_48;
  ParamIterator<const_libaom_test::CodecFactory_*> local_40;
  ParamIterator<int> local_38;
  
  (this->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_0100b768;
  this->base_ = base;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             ).
             super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>
             ._M_head_impl.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_48._M_head_impl =
       (ParamIteratorInterface<libaom_test::TestMode> *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             ).
             super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .
             super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_50._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var_01,iVar1);
  local_58.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl._0_4_
       = (*((generators->
            super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            ).
            super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .
            super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .
            super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_
            .
            super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_58.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl._4_4_
       = extraout_var_02;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .
                                  super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .
                                  super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .super__Tuple_impl<4UL,_testing::internal::ParamGenerator<int>_>.
                                  super__Head_base<4UL,_testing::internal::ParamGenerator<int>,_false>
                                  ._M_head_impl + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              *)&this->begin_,&local_40,(ParamIterator<libaom_test::TestMode> *)&local_48,
             (ParamIterator<int> *)&local_50,&local_58,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_58.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_58.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_50._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (*(local_50._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  if (local_48._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (*(local_48._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_40.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
        ._M_head_impl)[1])();
  }
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_03;
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             ).
             super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>
             ._M_head_impl.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_48._M_head_impl =
       (ParamIteratorInterface<libaom_test::TestMode> *)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (*((generators->
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             ).
             super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .
             super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
             .super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_50._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var_05,iVar1);
  local_58.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl._0_4_
       = (*((generators->
            super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            ).
            super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .
            super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .
            super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            .super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_
            .
            super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_58.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl._4_4_
       = extraout_var_06;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        )(**(code **)(**(long **)&(generators->
                                  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  ).
                                  super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .
                                  super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .
                                  super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                                  .super__Tuple_impl<4UL,_testing::internal::ParamGenerator<int>_>.
                                  super__Head_base<4UL,_testing::internal::ParamGenerator<int>,_false>
                                  ._M_head_impl + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              *)&this->end_,&local_40,(ParamIterator<libaom_test::TestMode> *)&local_48,
             (ParamIterator<int> *)&local_50,&local_58,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_58.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_58.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_50._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (*(local_50._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  if (local_48._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (*(local_48._M_head_impl)->_vptr_ParamIteratorInterface[1])();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_40.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
        ._M_head_impl)[1])();
  }
  p_Var2 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ;
  if (is_end) {
    p_Var2 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                ,p_Var2);
  (this->current_value_).
  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }